

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

LY_ERR ly_path_eval(ly_path *path,lyd_node *start,lyxp_var *vars,lyd_node **match)

{
  LY_ERR LVar1;
  lyd_node *in_RAX;
  lyd_node *m;
  
  m = in_RAX;
  LVar1 = ly_path_eval_partial(path,start,vars,'\0',(uint64_t *)0x0,&m);
  if (LVar1 == LY_SUCCESS) {
    if (match == (lyd_node **)0x0) {
      return LY_SUCCESS;
    }
    LVar1 = LY_SUCCESS;
  }
  else {
    LVar1 = LY_ENOTFOUND;
    if (match == (lyd_node **)0x0) {
      return LY_ENOTFOUND;
    }
    m = (lyd_node *)0x0;
  }
  *match = m;
  return LVar1;
}

Assistant:

LY_ERR
ly_path_eval(const struct ly_path *path, const struct lyd_node *start, const struct lyxp_var *vars, struct lyd_node **match)
{
    LY_ERR ret;
    struct lyd_node *m;

    ret = ly_path_eval_partial(path, start, vars, 0, NULL, &m);

    if (ret == LY_SUCCESS) {
        /* last node was found */
        if (match) {
            *match = m;
        }
        return LY_SUCCESS;
    }

    /* not a full match */
    if (match) {
        *match = NULL;
    }
    return LY_ENOTFOUND;
}